

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::RsRuleSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,RsRuleSyntax *this,size_t index)

{
  SyntaxNode *local_40;
  size_t index_local;
  RsRuleSyntax *this_local;
  
  if (index == 0) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->randJoin->super_SyntaxNode)
    ;
  }
  else if (index == 1) {
    local_40 = (SyntaxNode *)0x0;
    if (this != (RsRuleSyntax *)0xffffffffffffffe8) {
      local_40 = &(this->prods).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_40);
  }
  else if (index == 2) {
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&this->weightClause->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax RsRuleSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return randJoin;
        case 1: return &prods;
        case 2: return weightClause;
        default: return nullptr;
    }
}